

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_follow(Curl_easy *data,char *newurl,followtype type)

{
  bool bVar1;
  _Bool _Var2;
  CURLUcode CVar3;
  CURLcode CVar4;
  char *pcVar5;
  uint flags;
  CURLUcode uc;
  _Bool reachedmax;
  _Bool disallowport;
  char *pcStack_20;
  followtype type_local;
  char *newurl_local;
  Curl_easy *data_local;
  
  bVar1 = false;
  uc = type;
  pcStack_20 = newurl;
  newurl_local = (char *)data;
  if (type == FOLLOW_REDIR) {
    if (((data->set).maxredirs == -1) || ((data->set).followlocation < (data->set).maxredirs)) {
      *(ushort *)&(data->state).field_0x4e4 = *(ushort *)&(data->state).field_0x4e4 & 0xfffd | 2;
      (data->set).followlocation = (data->set).followlocation + 1;
      if ((*(ulong *)&(data->set).field_0x878 >> 0x1b & 1) != 0) {
        if (((byte)(data->change).field_0x20 >> 1 & 1) != 0) {
          (*Curl_cfree)((data->change).referer);
          newurl_local[0xef0] = '\0';
          newurl_local[0xef1] = '\0';
          newurl_local[0xef2] = '\0';
          newurl_local[0xef3] = '\0';
          newurl_local[0xef4] = '\0';
          newurl_local[0xef5] = '\0';
          newurl_local[0xef6] = '\0';
          newurl_local[0xef7] = '\0';
          newurl_local[0xf08] = newurl_local[0xf08] & 0xfd;
        }
        pcVar5 = (*Curl_cstrdup)(*(char **)(newurl_local + 0xee8));
        *(char **)(newurl_local + 0xef0) = pcVar5;
        if (*(long *)(newurl_local + 0xef0) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        newurl_local[0xf08] = newurl_local[0xf08] & 0xfdU | 2;
      }
    }
    else {
      bVar1 = true;
      uc = CURLUE_BAD_HANDLE;
    }
  }
  _Var2 = Curl_is_absolute_url(pcStack_20,(char *)0x0,0x28);
  flags = 0;
  if (uc == CURLUE_BAD_HANDLE) {
    flags = 8;
  }
  CVar3 = curl_url_set(*(CURLU **)(newurl_local + 0x1528),CURLUPART_URL,pcStack_20,flags);
  if (CVar3 == CURLUE_OK) {
    CVar3 = curl_url_get(*(CURLU **)(newurl_local + 0x1528),CURLUPART_URL,&stack0xffffffffffffffe0,0
                        );
    if (CVar3 != CURLUE_OK) {
      CVar4 = Curl_uc_to_curlcode(CVar3);
      return CVar4;
    }
  }
  else {
    if (uc != CURLUE_BAD_HANDLE) {
      CVar4 = Curl_uc_to_curlcode(CVar3);
      return CVar4;
    }
    pcStack_20 = (*Curl_cstrdup)(pcStack_20);
    if (pcStack_20 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (uc == CURLUE_BAD_HANDLE) {
    *(char **)(newurl_local + 0x1620) = pcStack_20;
    if (bVar1) {
      Curl_failf((Curl_easy *)newurl_local,"Maximum (%ld) redirects followed",
                 *(undefined8 *)(newurl_local + 0x6d0));
      data_local._4_4_ = CURLE_TOO_MANY_REDIRECTS;
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    if (_Var2) {
      *(ushort *)(newurl_local + 0x1584) = *(ushort *)(newurl_local + 0x1584) & 0xffef;
    }
    if ((newurl_local[0xf08] & 1U) != 0) {
      (*Curl_cfree)(*(void **)(newurl_local + 0xee8));
      newurl_local[0xee8] = '\0';
      newurl_local[0xee9] = '\0';
      newurl_local[0xeea] = '\0';
      newurl_local[0xeeb] = '\0';
      newurl_local[0xeec] = '\0';
      newurl_local[0xeed] = '\0';
      newurl_local[0xeee] = '\0';
      newurl_local[0xeef] = '\0';
    }
    *(char **)(newurl_local + 0xee8) = pcStack_20;
    newurl_local[0xf08] = newurl_local[0xf08] | 1;
    Curl_infof((Curl_easy *)newurl_local,"Issue another request to this URL: \'%s\'\n",
               *(undefined8 *)(newurl_local + 0xee8));
    switch(*(undefined4 *)(newurl_local + 0x15d8)) {
    case 0x12d:
      if ((((*(int *)(newurl_local + 0xa38) == 2) || (*(int *)(newurl_local + 0xa38) == 3)) ||
          (*(int *)(newurl_local + 0xa38) == 4)) && ((*(uint *)(newurl_local + 0x6d8) & 1) == 0)) {
        Curl_infof((Curl_easy *)newurl_local,"Switch from POST to GET\n");
        newurl_local[0xa38] = '\x01';
        newurl_local[0xa39] = '\0';
        newurl_local[0xa3a] = '\0';
        newurl_local[0xa3b] = '\0';
      }
      break;
    case 0x12e:
      if ((((*(int *)(newurl_local + 0xa38) == 2) || (*(int *)(newurl_local + 0xa38) == 3)) ||
          (*(int *)(newurl_local + 0xa38) == 4)) && ((*(uint *)(newurl_local + 0x6d8) & 2) == 0)) {
        Curl_infof((Curl_easy *)newurl_local,"Switch from POST to GET\n");
        newurl_local[0xa38] = '\x01';
        newurl_local[0xa39] = '\0';
        newurl_local[0xa3a] = '\0';
        newurl_local[0xa3b] = '\0';
      }
      break;
    case 0x12f:
      if ((*(int *)(newurl_local + 0xa38) != 1) && ((*(uint *)(newurl_local + 0x6d8) & 4) == 0)) {
        newurl_local[0xa38] = '\x01';
        newurl_local[0xa39] = '\0';
        newurl_local[0xa3a] = '\0';
        newurl_local[0xa3b] = '\0';
        pcVar5 = "GET";
        if ((*(ulong *)(newurl_local + 0xee0) >> 0x1c & 1) != 0) {
          pcVar5 = "HEAD";
        }
        Curl_infof((Curl_easy *)newurl_local,"Disables POST, goes with %s\n",pcVar5);
      }
      break;
    case 0x130:
      break;
    case 0x131:
    }
    Curl_pgrsTime((Curl_easy *)newurl_local,TIMER_REDIRECT);
    Curl_pgrsResetTransferSizes((Curl_easy *)newurl_local);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_follow(struct Curl_easy *data,
                     char *newurl,    /* the Location: string */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;
  bool reachedmax = FALSE;
  CURLUcode uc;

  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
       (data->set.followlocation >= data->set.maxredirs)) {
      reachedmax = TRUE;
      type = FOLLOW_FAKE; /* switch to fake to store the would-be-redirected
                             to URL */
    }
    else {
      /* mark the next request as a followed location: */
      data->state.this_is_a_follow = TRUE;

      data->set.followlocation++; /* count location-followers */

      if(data->set.http_auto_referer) {
        /* We are asked to automatically set the previous URL as the referer
           when we get the next URL. We pick the ->url field, which may or may
           not be 100% correct */

        if(data->change.referer_alloc) {
          Curl_safefree(data->change.referer);
          data->change.referer_alloc = FALSE;
        }

        data->change.referer = strdup(data->change.url);
        if(!data->change.referer)
          return CURLE_OUT_OF_MEMORY;
        data->change.referer_alloc = TRUE; /* yes, free this later */
      }
    }
  }

  if(Curl_is_absolute_url(newurl, NULL, MAX_SCHEME_LEN))
    /* This is an absolute URL, don't allow the custom port number */
    disallowport = TRUE;

  DEBUGASSERT(data->state.uh);
  uc = curl_url_set(data->state.uh, CURLUPART_URL, newurl,
                    (type == FOLLOW_FAKE) ? CURLU_NON_SUPPORT_SCHEME : 0);
  if(uc) {
    if(type != FOLLOW_FAKE)
      return Curl_uc_to_curlcode(uc);

    /* the URL could not be parsed for some reason, but since this is FAKE
       mode, just duplicate the field as-is */
    newurl = strdup(newurl);
    if(!newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else {

    uc = curl_url_get(data->state.uh, CURLUPART_URL, &newurl, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;

    if(reachedmax) {
      failf(data, "Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->change.url_alloc)
    Curl_safefree(data->change.url);

  data->change.url = newurl;
  data->change.url_alloc = TRUE;

  infof(data, "Issue another request to this URL: '%s'\n", data->change.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM
        || data->set.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM
        || data->set.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* Disable both types of POSTs, unless the user explicitly
       asks for POST after POST */
    if(data->set.httpreq != HTTPREQ_GET
      && !(data->set.keep_post & CURL_REDIR_POST_303)) {
      data->set.httpreq = HTTPREQ_GET; /* enforce GET request */
      infof(data, "Disables POST, goes with %s\n",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}